

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O3

int cupdlp_dcs_entry(cupdlp_dcs *T,int i,int j,double x)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if ((T != (cupdlp_dcs *)0x0) && (uVar2 = T->nz, iVar1 = 0, -1 < (int)(j | i | uVar2))) {
    if (T->nzmax <= (int)uVar2) {
      iVar1 = cupdlp_dcs_sprealloc(T,T->nzmax * 2);
      if (iVar1 == 0) {
        return 0;
      }
      uVar2 = T->nz;
    }
    if (T->x != (double *)0x0) {
      T->x[(int)uVar2] = x;
    }
    T->i[(int)uVar2] = i;
    iVar1 = T->nz;
    T->nz = iVar1 + 1;
    T->p[iVar1] = j;
    iVar1 = i + 1;
    if (i + 1 < T->m) {
      iVar1 = T->m;
    }
    T->m = iVar1;
    iVar1 = j + 1;
    if (j + 1 < T->n) {
      iVar1 = T->n;
    }
    T->n = iVar1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int cupdlp_dcs_entry(cupdlp_dcs *T, int i, int j, double x) {
  if (!IS_TRIPLET(T) || i < 0 || j < 0) return (0); /* check inputs */
  if (T->nz >= T->nzmax && !cupdlp_dcs_sprealloc(T, 2 * (T->nzmax))) return (0);
  if (T->x) T->x[T->nz] = x;
  T->i[T->nz] = i;
  T->p[T->nz++] = j;
  T->m = MAX(T->m, i + 1);
  T->n = MAX(T->n, j + 1);
  return (1);
}